

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  ZSTD_ErrorCode ZVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  XXH64_hash_t XVar5;
  size_t sVar6;
  ulong uVar7;
  uint *src_00;
  byte bVar8;
  void *dst_00;
  void *dst_01;
  uint *puVar9;
  size_t sStack_a0;
  blockProperties_t local_5c;
  byte *local_50;
  void *local_48;
  size_t local_40;
  void *local_38;
  
  local_40 = dictSize;
  if (ddict != (ZSTD_DDict *)0x0) {
    dict = ddict->dictContent;
    local_40 = ddict->dictSize;
  }
  bVar8 = 0;
  dst_01 = dst;
  do {
    while( true ) {
      sVar4 = 0xffffffffffffffb8;
      if (srcSize < 5) {
        if (srcSize == 0) {
          sVar4 = (long)dst_01 - (long)dst;
        }
        return sVar4;
      }
      if ((*src & 0xfffffff0) != 0x184d2a50) break;
      if (srcSize < 8) {
        return 0xffffffffffffffb8;
      }
      uVar2 = (ulong)*(uint *)((long)src + 4) + 8;
      if (srcSize < uVar2) {
        return 0xffffffffffffffb8;
      }
      src = (uint *)((long)src + uVar2);
      srcSize = srcSize - uVar2;
    }
    local_38 = dst;
    if (ddict == (ZSTD_DDict *)0x0) {
      sVar3 = ZSTD_decompressBegin_usingDict(dctx,dict,local_40);
      if (0xffffffffffffff88 < sVar3) {
        return sVar3;
      }
    }
    else {
      ZSTD_decompressBegin_usingDDict(dctx,ddict);
    }
    local_48 = dict;
    ZSTD_checkContinuity(dctx,dst_01);
    sStack_a0 = sVar4;
    puVar9 = (uint *)src;
    uVar2 = srcSize;
    if ((((8 < srcSize) &&
         (sVar3 = ZSTD_frameHeaderSize(src,5), sStack_a0 = sVar3, sVar3 < 0xffffffffffffff89)) &&
        (sStack_a0 = sVar4, sVar3 + 3 <= srcSize)) &&
       (sStack_a0 = ZSTD_decodeFrameHeader(dctx,src,sVar3), sStack_a0 < 0xffffffffffffff89)) {
      src_00 = (uint *)((long)src + sVar3);
      sVar3 = srcSize - sVar3;
      dst_00 = dst_01;
      do {
        sVar4 = ZSTD_getcBlockSize(src_00,sVar3,&local_5c);
        sStack_a0 = sVar4;
        if (0xffffffffffffff88 < sVar4) goto LAB_00185bb5;
        uVar7 = sVar3 - 3;
        sVar3 = uVar7 - sVar4;
        if (uVar7 < sVar4) {
          sStack_a0 = 0xffffffffffffffb8;
          goto LAB_00185bb5;
        }
        local_50 = (byte *)((long)src_00 + 3);
        if (local_5c.blockType == bt_compressed) {
          sStack_a0 = ZSTD_decompressBlock_internal
                                (dctx,dst_00,(long)dst_01 + (dstCapacity - (long)dst_00),local_50,
                                 sVar4,1);
          if (0xffffffffffffff88 < sStack_a0) goto LAB_00185bb5;
        }
        else if (local_5c.blockType == bt_rle) {
          sStack_a0 = (size_t)local_5c.origSize;
          if ((long)dst_01 + (dstCapacity - (long)dst_00) < sStack_a0) {
            sStack_a0 = 0xffffffffffffffba;
            goto LAB_00185bb5;
          }
          memset(dst_00,(uint)*local_50,sStack_a0);
        }
        else {
          if (local_5c.blockType != bt_raw) {
            sStack_a0 = 0xffffffffffffffec;
            goto LAB_00185bb5;
          }
          sStack_a0 = 0xffffffffffffffba;
          if ((long)dst_01 + (dstCapacity - (long)dst_00) < sVar4) goto LAB_00185bb5;
          memcpy(dst_00,local_50,sVar4);
          sStack_a0 = sVar4;
        }
        if ((dctx->fParams).checksumFlag != 0) {
          XXH64_update(&dctx->xxhState,dst_00,sStack_a0);
        }
        dst_00 = (void *)((long)dst_00 + sStack_a0);
        src_00 = (uint *)(local_50 + sVar4);
      } while (local_5c.lastBlock == 0);
      sVar4 = (dctx->fParams).frameContentSize;
      sVar6 = (long)dst_00 - (long)dst_01;
      if ((sVar4 == 0xffffffffffffffff) || (sVar6 == sVar4)) {
        sStack_a0 = sVar6;
        puVar9 = src_00;
        uVar2 = sVar3;
        if ((dctx->fParams).checksumFlag != 0) {
          XVar5 = XXH64_digest(&dctx->xxhState);
          if (sVar3 < 4) {
            sStack_a0 = 0xffffffffffffffea;
            puVar9 = (uint *)src;
            uVar2 = srcSize;
          }
          else {
            sStack_a0 = 0xffffffffffffffea;
            puVar9 = (uint *)src;
            uVar2 = srcSize;
            if (*src_00 == (uint)XVar5) {
              sStack_a0 = sVar6;
              puVar9 = src_00 + 1;
              uVar2 = sVar3 - 4;
            }
          }
        }
      }
      else {
        sStack_a0 = 0xffffffffffffffec;
      }
    }
LAB_00185bb5:
    ZVar1 = ZSTD_getErrorCode(sStack_a0);
    if ((bool)(bVar8 & ZVar1 == ZSTD_error_prefix_unknown)) {
      return 0xffffffffffffffb8;
    }
    if (0xffffffffffffff88 < sStack_a0) {
      return sStack_a0;
    }
    dst_01 = (void *)((long)dst_01 + sStack_a0);
    dstCapacity = dstCapacity - sStack_a0;
    bVar8 = 1;
    dict = local_48;
    dst = local_38;
    src = puVar9;
    srcSize = uVar2;
  } while( true );
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDictDictContent(ddict);
        dictSize = ZSTD_DDictDictSize(ddict);
    }

    while (srcSize >= ZSTD_frameHeaderSize_prefix) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            /* legacy support is not compatible with static dctx */
            if (dctx->staticSize) return ERROR(memory_allocation);

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);

            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        {   U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(4, "reading magic number %08X (expecting %08X)",
                        (U32)magicNumber, (U32)ZSTD_MAGICNUMBER);
            if ((magicNumber & 0xFFFFFFF0U) == ZSTD_MAGIC_SKIPPABLE_START) {
                size_t skippableSize;
                if (srcSize < ZSTD_skippableHeaderSize)
                    return ERROR(srcSize_wrong);
                skippableSize = MEM_readLE32((const BYTE*)src + ZSTD_frameIdSize)
                              + ZSTD_skippableHeaderSize;
                if (srcSize < skippableSize) return ERROR(srcSize_wrong);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue;
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            CHECK_F(ZSTD_decompressBegin_usingDDict(dctx, ddict));
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            CHECK_F(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize));
        }
        ZSTD_checkContinuity(dctx, dst);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            if ( (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
              && (moreThan1Frame==1) ) {
                /* at least one frame successfully completed,
                 * but following bytes are garbage :
                 * it's more likely to be a srcSize error,
                 * specifying more bytes than compressed size of frame(s).
                 * This error message replaces ERROR(prefix_unknown),
                 * which would be confusing, as the first header is actually correct.
                 * Note that one could be unlucky, it might be a corruption error instead,
                 * happening right at the place where we expect zstd magic bytes.
                 * But this is _much_ less likely than a srcSize field error. */
                return ERROR(srcSize_wrong);
            }
            if (ZSTD_isError(res)) return res;
            /* no need to bound check, ZSTD_decompressFrame already has */
            dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    if (srcSize) return ERROR(srcSize_wrong); /* input not entirely consumed */

    return (BYTE*)dst - (BYTE*)dststart;
}